

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O1

xml_attribute __thiscall
NULLCPugiXML::xml_node__append_attribute(NULLCPugiXML *this,NULLCArray name,xml_node *ptr)

{
  undefined4 in_register_00000014;
  xml_attribute ret;
  xml_attribute local_20;
  
  if (this == (NULLCPugiXML *)0x0) {
    nullcThrowError("name is empty",name.ptr);
    local_20._attr = (xml_attribute_struct *)0x0;
    pugi::xml_attribute::xml_attribute(&local_20);
  }
  else {
    pugi::xml_attribute::xml_attribute(&local_20);
    local_20 = pugi::xml_node::append_attribute
                         ((xml_node *)CONCAT44(in_register_00000014,name.len),(char_t *)this);
  }
  return (xml_attribute)(xml_attribute)local_20._attr;
}

Assistant:

xml_attribute xml_node__append_attribute(NULLCArray name, xml_node* ptr)
	{
		if(!name.ptr)
		{
			nullcThrowError("name is empty");
			return xml_attribute();
		}
		xml_attribute ret;
		ret.attribute = ptr->node.append_attribute(name.ptr);
		return ret;
	}